

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
eastl::vector<eastl::pair<int,_int>,_eastl::allocator>::DoInsertValue
          (vector<eastl::pair<int,_int>,_eastl::allocator> *this,iterator position,value_type *value
          )

{
  pair<int,_int> **pppVar1;
  pair<int,_int> *ppVar2;
  int iVar3;
  iterator ppVar4;
  iterator ppVar5;
  value_type *pvVar6;
  uint uVar7;
  generic_iterator<eastl::pair<int,_int>_*,_void> currentDest;
  value_type *pvVar8;
  value_type *pvVar9;
  
  pvVar6 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
  if (pvVar6 == (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpCapacity) {
    pvVar9 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpBegin;
    iVar3 = (int)((ulong)((long)pvVar6 - (long)pvVar9) >> 3);
    uVar7 = 1;
    if (iVar3 != 0) {
      uVar7 = iVar3 * 2;
    }
    if (uVar7 == 0) {
      pvVar6 = (value_type *)0x0;
      pvVar8 = pvVar6;
    }
    else {
      pvVar6 = (value_type *)malloc((ulong)uVar7 * 8);
      pvVar8 = pvVar6;
    }
    for (; pvVar9 != position; pvVar9 = pvVar9 + 1) {
      *pvVar6 = *pvVar9;
      pvVar6 = pvVar6 + 1;
    }
    *pvVar6 = *value;
    pvVar9 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
    pvVar6 = pvVar6 + 1;
    if (pvVar9 != position) {
      do {
        *pvVar6 = *position;
        position = position + 1;
        pvVar6 = pvVar6 + 1;
      } while (position != pvVar9);
    }
    ppVar2 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpBegin;
    if (ppVar2 != (pair<int,_int> *)0x0) {
      operator_delete__(ppVar2);
    }
    (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpBegin = pvVar8;
    (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd = pvVar6;
    (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpCapacity = pvVar8 + uVar7;
  }
  else {
    *pvVar6 = pvVar6[-1];
    ppVar5 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
    while (ppVar4 = ppVar5 + -1, ppVar4 != position) {
      *ppVar4 = ppVar5[-2];
      ppVar5 = ppVar4;
    }
    iVar3 = value[value < pvVar6 && position <= value].second;
    position->first = value[value < pvVar6 && position <= value].first;
    position->second = iVar3;
    pppVar1 = &(this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, const value_type& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(*(mpEnd - 1));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(value);
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }